

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void __thiscall Draw::PrintUi(Draw *this,GameData *Data,bool flagQuit,bool flagGameOver)

{
  int iVar1;
  int num;
  ostream *poVar2;
  char *pcVar3;
  int i;
  int j;
  int y;
  char *pcVar4;
  GameData *pGVar5;
  
  std::operator<<((ostream *)&std::cout,"            HAPPY!     SCORE: ");
  pGVar5 = Data;
  iVar1 = GameData::GetScore(Data);
  PrintNumAlignCenter((Draw *)pGVar5,iVar1,6,true);
  std::operator<<((ostream *)&std::cout,"     BEST: ");
  pGVar5 = Data;
  iVar1 = GameData::GetBestScore(Data);
  PrintNumAlignCenter((Draw *)pGVar5,iVar1,6,true);
  poVar2 = std::operator<<((ostream *)&std::cout,"     !HAPPY");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "            ----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "                       |------|------|------|------|");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    std::operator<<((ostream *)&std::cout,"                       |");
    for (y = 0; y != 4; y = y + 1) {
      pGVar5 = Data;
      num = GameData::GetPositionNumber(Data,iVar1,y);
      PrintNumAlignCenter((Draw *)pGVar5,num,6,false);
      std::operator<<((ostream *)&std::cout,"|");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "                       |------|------|------|------|");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "            ----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar3 = "              [W]:UP  [S]:DOWN  [A]:LEFT  [D]:RIGHT  [Q]:EXIT";
  if (flagQuit) {
    pcVar3 = "                Do you really want to quite the game?([Y]/[N])            ";
  }
  pcVar4 = "                Do you want to play the game again?([Y]/[N])              ";
  if (!flagGameOver) {
    pcVar4 = pcVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Draw::PrintUi(GameData Data, bool flagQuit, bool flagGameOver) {
    std::cout << "            HAPPY!     SCORE: ";
    PrintNumAlignCenter(Data.GetScore(), 6, true);
    std::cout << "     BEST: ";
    PrintNumAlignCenter(Data.GetBestScore(), 6, true);
    std::cout << "     !HAPPY" << std::endl;
    std::cout << "            ----------------------------------------------------" << std::endl;
    std::cout << std::endl << std::endl;
    std::cout << "                       |------|------|------|------|" << std::endl;

    for (int i = 0; i < 4; i++) {
        std::cout << "                       |";
        for (int j = 0; j < 4; j++) {
            PrintNumAlignCenter(Data.GetPositionNumber(i, j), 6, false);
            std::cout << ("|");
        }
        std::cout << std::endl;
        std::cout << "                       |------|------|------|------|" << std::endl;
    }

    std::cout << std::endl << std::endl;
    std::cout << "            ----------------------------------------------------" << std::endl;
    if (flagGameOver)
        std::cout << "                Do you want to play the game again?([Y]/[N])              " << std::endl;
    else if (flagQuit)
        std::cout << "                Do you really want to quite the game?([Y]/[N])            " << std::endl;
    else
        std::cout << "              [W]:UP  [S]:DOWN  [A]:LEFT  [D]:RIGHT  [Q]:EXIT" << std::endl;
}